

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTypeID lj_ctype_intern(CTState *cts,CTInfo info,CTSize size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CType *pCVar4;
  ushort uVar5;
  MSize MVar6;
  
  uVar3 = (size ^ info) - (size << 0xe | size >> 0x12);
  uVar3 = (size >> 0xd ^ uVar3) - (uVar3 >> 0x13) & 0x7f;
  uVar5 = cts->hash[uVar3];
  if (uVar5 != 0) {
    pCVar4 = cts->tab;
    do {
      if ((pCVar4[uVar5].info == info) && (pCVar4[uVar5].size == size)) {
        return (uint)uVar5;
      }
      uVar5 = pCVar4[uVar5].next;
    } while (uVar5 != 0);
  }
  uVar1 = cts->top;
  uVar2 = cts->sizetab;
  if (uVar1 < uVar2) {
    pCVar4 = cts->tab;
  }
  else {
    if (0xffff < uVar1) {
      lj_err_msg(cts->L,LJ_ERR_TABOV);
    }
    MVar6 = 8;
    if (8 < uVar2 * 2) {
      MVar6 = uVar2 * 2;
    }
    if (0xffff < MVar6) {
      MVar6 = 0x10000;
    }
    pCVar4 = (CType *)lj_mem_realloc(cts->L,cts->tab,uVar2 << 4,MVar6 << 4);
    cts->sizetab = MVar6;
    cts->tab = pCVar4;
  }
  cts->top = uVar1 + 1;
  pCVar4[uVar1].info = info;
  pCVar4[uVar1].size = size;
  pCVar4[uVar1].sib = 0;
  pCVar4[uVar1].next = cts->hash[uVar3];
  pCVar4[uVar1].name.gcptr32 = 0;
  cts->hash[uVar3] = (CTypeID1)uVar1;
  return uVar1;
}

Assistant:

CTypeID lj_ctype_intern(CTState *cts, CTInfo info, CTSize size)
{
  uint32_t h = ct_hashtype(info, size);
  CTypeID id = cts->hash[h];
  lua_assert(cts->L);
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (ct->info == info && ct->size == size)
      return id;
    id = ct->next;
  }
  id = cts->top;
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
  }
  cts->top = id+1;
  cts->tab[id].info = info;
  cts->tab[id].size = size;
  cts->tab[id].sib = 0;
  cts->tab[id].next = cts->hash[h];
  setgcrefnull(cts->tab[id].name);
  cts->hash[h] = (CTypeID1)id;
  return id;
}